

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void relative16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t address_00;
  cs_detail *pcVar2;
  uint16_t offset;
  
  offset = 0;
  address_00 = *address;
  read_word(info,&offset,address_00);
  *address = address_00 + 2;
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  (info->m680x).operands[bVar1].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar1].size = '\0';
  (info->m680x).operands[bVar1].field_1.rel.offset = offset;
  (info->m680x).operands[bVar1].field_1.rel.address = offset + address_00 + 2;
  pcVar2 = MI->flat_insn->detail;
  if (pcVar2 != (cs_detail *)0x0) {
    bVar1 = pcVar2->groups_count;
    pcVar2->groups_count = bVar1 + 1;
    pcVar2->groups[bVar1] = '\a';
  }
  if (info->insn - M680X_INS_LBRA < 3) {
    return;
  }
  add_reg_to_rw_list(MI,M680X_REG_CC,READ);
  return;
}

Assistant:

static void relative16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	*address += 2;
	add_rel_operand(info, (int16_t)offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_LBRA) &&
		(info->insn != M680X_INS_LBSR) &&
		(info->insn != M680X_INS_LBRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}